

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O2

UDataMemory *
doLoadFromIndividualFiles
          (char *pkgName,char *dataPath,char *tocEntryPathSuffix,char *path,char *type,char *name,
          UDataMemoryIsAcceptable *isAcceptable,void *context,UErrorCode *subErrorCode,
          UErrorCode *pErrorCode)

{
  UBool UVar1;
  char *path_00;
  UDataMemory *pUVar2;
  UDataPathIterator iter;
  UDataMemory *local_168;
  UDataMemory local_160;
  UDataPathIterator local_128;
  
  local_168 = (UDataMemory *)0x0;
  icu_63::UDataPathIterator::UDataPathIterator
            (&local_128,dataPath,pkgName,path,tocEntryPathSuffix,'\0',pErrorCode);
  do {
    do {
      path_00 = icu_63::UDataPathIterator::next(&local_128,pErrorCode);
      if (path_00 == (char *)0x0) {
LAB_002a1cf5:
        icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_128.packageStub.buffer);
        icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_128.pathBuffer.buffer);
        icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_128.itemPath.buffer);
        return local_168;
      }
      UVar1 = uprv_mapFile_63(&local_160,path_00,pErrorCode);
    } while (UVar1 == '\0');
    pUVar2 = checkDataItem(local_160.pHeader,isAcceptable,context,type,name,subErrorCode,pErrorCode)
    ;
    if (pUVar2 != (UDataMemory *)0x0) {
      pUVar2->mapAddr = local_160.mapAddr;
      pUVar2->map = local_160.map;
      local_168 = pUVar2;
      goto LAB_002a1cf5;
    }
    udata_close_63(&local_160);
    if (U_ZERO_ERROR < *pErrorCode) goto LAB_002a1cf5;
    *subErrorCode = U_INVALID_FORMAT_ERROR;
  } while( true );
}

Assistant:

static UDataMemory *doLoadFromIndividualFiles(const char *pkgName, 
        const char *dataPath, const char *tocEntryPathSuffix,
            /* following arguments are the same as doOpenChoice itself */
            const char *path, const char *type, const char *name,
             UDataMemoryIsAcceptable *isAcceptable, void *context,
             UErrorCode *subErrorCode,
             UErrorCode *pErrorCode)
{
    const char         *pathBuffer;
    UDataMemory         dataMemory;
    UDataMemory *pEntryData;

    /* look in ind. files: package\nam.typ  ========================= */
    /* init path iterator for individual files */
    UDataPathIterator iter(dataPath, pkgName, path, tocEntryPathSuffix, FALSE, pErrorCode);

    while ((pathBuffer = iter.next(pErrorCode)) != NULL)
    {
#ifdef UDATA_DEBUG
        fprintf(stderr, "UDATA: trying individual file %s\n", pathBuffer);
#endif
        if (uprv_mapFile(&dataMemory, pathBuffer, pErrorCode))
        {
            pEntryData = checkDataItem(dataMemory.pHeader, isAcceptable, context, type, name, subErrorCode, pErrorCode);
            if (pEntryData != NULL) {
                /* Data is good.
                *  Hand off ownership of the backing memory to the user's UDataMemory.
                *  and return it.   */
                pEntryData->mapAddr = dataMemory.mapAddr;
                pEntryData->map     = dataMemory.map;

#ifdef UDATA_DEBUG
                fprintf(stderr, "** Mapped file: %s\n", pathBuffer);
#endif
                return pEntryData;
            }

            /* the data is not acceptable, or some error occurred.  Either way, unmap the memory */
            udata_close(&dataMemory);

            /* If we had a nasty error, bail out completely.  */
            if (U_FAILURE(*pErrorCode)) {
                return NULL;
            }

            /* Otherwise remember that we found data but didn't like it for some reason  */
            *subErrorCode=U_INVALID_FORMAT_ERROR;
        }
#ifdef UDATA_DEBUG
        fprintf(stderr, "%s\n", UDataMemory_isLoaded(&dataMemory)?"LOADED":"not loaded");
#endif
    }
    return NULL;
}